

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void load256i128(uint16_t *out,secp256k1_int128 *v)

{
  undefined8 *in_RSI;
  uint16_t *in_RDI;
  secp256k1_int128 c;
  int64_t hi;
  uint64_t lo;
  undefined8 local_38;
  undefined8 local_30;
  uint64_t local_20;
  uint64_t local_18;
  uint16_t *local_8;
  
  local_38 = *in_RSI;
  local_30 = in_RSI[1];
  local_8 = in_RDI;
  local_18 = secp256k1_i128_to_u64((secp256k1_int128 *)&local_38);
  secp256k1_i128_rshift((secp256k1_int128 *)&local_38,0x40);
  local_20 = secp256k1_i128_to_i64((secp256k1_int128 *)&local_38);
  load256two64(local_8,local_20,local_18,1);
  return;
}

Assistant:

static void load256i128(uint16_t* out, const secp256k1_int128* v) {
    uint64_t lo;
    int64_t hi;
    secp256k1_int128 c = *v;
    lo = secp256k1_i128_to_u64(&c);
    secp256k1_i128_rshift(&c, 64);
    hi = secp256k1_i128_to_i64(&c);
    load256two64(out, hi, lo, 1);
}